

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_click(t_radio *x,t_floatarg xpos,t_floatarg ypos,t_floatarg shift,t_floatarg ctrl,
                t_floatarg alt)

{
  _glist *glist;
  int iVar1;
  
  glist = (x->x_gui).x_glist;
  if (x->x_orientation == horizontal) {
    iVar1 = text_xpix((t_text *)x,glist);
    iVar1 = ((int)xpos - iVar1) / (x->x_gui).x_w;
  }
  else {
    iVar1 = text_ypix((t_text *)x,glist);
    iVar1 = ((int)ypos - iVar1) / (x->x_gui).x_h;
  }
  radio_fout(x,(float)iVar1);
  return;
}

Assistant:

static void radio_click(t_radio *x, t_floatarg xpos, t_floatarg ypos, t_floatarg shift, t_floatarg ctrl, t_floatarg alt)
{
    if (x->x_orientation == horizontal)
    {
        int xx = (int)xpos - (int)text_xpix(&x->x_gui.x_obj, x->x_gui.x_glist);
        radio_fout(x, (t_float)(xx / x->x_gui.x_w));
    } else {
        int yy =  (int)ypos - text_ypix(&x->x_gui.x_obj, x->x_gui.x_glist);
        radio_fout(x, (t_float)(yy / x->x_gui.x_h));
    }
}